

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArYieldResult * __thiscall
NEST::LArNEST::GetYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,LArInteraction species,double energy
          ,double dx,double efield,double density)

{
  double density_local;
  double efield_local;
  double dx_local;
  double energy_local;
  LArInteraction species_local;
  LArNEST *this_local;
  
  if (species == NR) {
    GetNRYields(__return_storage_ptr__,this,energy,efield,density);
  }
  else if (species == ER) {
    GetERYields(__return_storage_ptr__,this,energy,efield,density);
  }
  else if (species == Alpha) {
    GetAlphaYields(__return_storage_ptr__,this,energy,efield,density);
  }
  else if (species == LeptonLET) {
    GetLeptonLETYields(__return_storage_ptr__,this,energy,dx,efield,density);
  }
  else if (species == LET) {
    GetLETYields(__return_storage_ptr__,this,energy,dx,efield,density);
  }
  else {
    GetdEdxYields(__return_storage_ptr__,this,energy,dx,efield,density);
  }
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetYields(LArInteraction species, double energy,
                                  double dx, double efield, double density) {
  if (species == LArInteraction::NR) {
    return GetNRYields(energy, efield, density);
  } else if (species == LArInteraction::ER) {
    return GetERYields(energy, efield, density);
  } else if (species == LArInteraction::Alpha) {
    return GetAlphaYields(energy, efield, density);
  } else if (species == LArInteraction::LeptonLET) {
    return GetLeptonLETYields(energy, dx, efield, density);
  } else if (species == LArInteraction::LET) {
    return GetLETYields(energy, dx, efield, density);
  } else {
    return GetdEdxYields(energy, dx, efield, density);
  }
}